

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305.c
# Opt level: O2

void poly1305_auth(uchar *out,uchar *m,size_t inlen,uchar *key)

{
  byte bVar1;
  uint3 uVar2;
  undefined1 uVar3;
  uint uVar4;
  size_t sVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  ulong uVar29;
  undefined4 local_88;
  undefined4 local_84;
  undefined4 local_80;
  uint local_7c;
  ulong *local_70;
  uchar *local_68;
  uchar *local_60;
  uchar mp [16];
  
  uVar2 = *(uint3 *)key;
  bVar1 = key[3];
  uVar17 = ((uint)*(uint3 *)(key + 4) << 6 | (uint)(bVar1 >> 2)) & 0x3ffff03;
  uVar19 = ((uint)*(ushort *)(key + 8) << 0xc |
           ((uint)key[7] << 0x18 | (uint)key[6] << 0x10) >> 0x14) & 0x3ffc0ff;
  uVar20 = ((uint)key[0xc] << 0x12 |
           ((uint)*(ushort *)(key + 10) << 0x10 | (uint)key[9] << 8) >> 0xe) & 0x3f03fff;
  mp._8_8_ = ZEXT48(uVar20);
  uVar6 = (key[0xf] & 0xf) << 0x10 | (uint)key[0xe] << 8 | (uint)key[0xd];
  mp._0_8_ = ZEXT48(uVar6);
  uVar27 = 0;
  uVar4 = 0;
  uVar18 = 0;
  uVar15 = 0;
  uVar9 = 0;
  local_68 = key;
  local_60 = out;
  if (inlen < 0x10) goto LAB_0011e032;
  do {
    local_70 = (ulong *)((long)m + 0x10);
    inlen = inlen - 0x10;
    uVar9 = ((uint)*(ulong *)m & 0x3ffffff) + uVar9;
    uVar15 = ((uint)(*(ulong *)m >> 0x1a) & 0x3ffffff) + uVar15;
    uVar18 = ((uint)(*(ulong *)((long)m + 4) >> 0x14) & 0x3ffffff) + uVar18;
    uVar4 = ((uint)(*(ulong *)((long)m + 8) >> 0xe) & 0x3ffffff) + uVar4;
    uVar27 = uVar27 + (*(uint *)((long)m + 0xc) >> 8) + 0x1000000;
    while( true ) {
      uVar14 = (ulong)uVar9;
      uVar22 = (ulong)((bVar1 & 3) << 0x18 | (uint)uVar2);
      uVar16 = (ulong)uVar15;
      uVar13 = (ulong)(uVar6 * 5);
      uVar11 = (ulong)uVar18;
      uVar12 = (ulong)(uVar20 * 5);
      uVar7 = (ulong)uVar4;
      uVar25 = (ulong)(uVar19 * 5);
      uVar23 = (ulong)uVar27;
      uVar24 = (uVar17 * 5) * uVar23 + uVar7 * uVar25 + uVar11 * uVar12 + uVar16 * uVar13 +
               uVar14 * uVar22;
      uVar29 = (ulong)uVar17;
      uVar10 = (ulong)uVar19;
      uVar25 = (uVar24 >> 0x1a) +
               uVar25 * uVar23 + uVar7 * uVar12 + uVar11 * uVar13 + uVar16 * uVar22 +
               uVar14 * uVar29;
      uVar12 = (uVar25 >> 0x1a & 0xffffffff) +
               uVar12 * uVar23 + uVar7 * uVar13 + uVar11 * uVar22 + uVar16 * uVar29 +
               uVar14 * uVar10;
      uVar13 = (uVar12 >> 0x1a & 0xffffffff) +
               uVar13 * uVar23 + uVar7 * uVar22 + uVar11 * uVar29 + uVar16 * uVar10 +
               uVar14 * (mp._8_8_ & 0xffffffff);
      uVar7 = (uVar13 >> 0x1a & 0xffffffff) +
              uVar23 * uVar22 + uVar7 * uVar29 + uVar11 * uVar10 + uVar16 * (mp._8_8_ & 0xffffffff)
              + (mp._0_8_ & 0xffffffff) * uVar14;
      uVar15 = (uint)uVar25 & 0x3ffffff;
      uVar18 = (uint)uVar12 & 0x3ffffff;
      uVar4 = (uint)uVar13 & 0x3ffffff;
      uVar27 = (uint)uVar7 & 0x3ffffff;
      uVar9 = (int)(uVar7 >> 0x1a) * 5 + ((uint)uVar24 & 0x3ffffff);
      m = (uchar *)local_70;
      if (0xf < inlen) break;
LAB_0011e032:
      if (inlen == 0) {
        uVar15 = (uVar9 >> 0x1a) + uVar15;
        uVar18 = (uVar15 >> 0x1a) + uVar18;
        uVar17 = uVar18 & 0x3ffffff;
        uVar4 = (uVar18 >> 0x1a) + uVar4;
        uVar19 = uVar4 & 0x3ffffff;
        uVar27 = (uVar4 >> 0x1a) + uVar27;
        uVar18 = (uVar27 >> 0x1a) * 5 + (uVar9 & 0x3ffffff);
        uVar21 = (uVar18 >> 0x1a) + (uVar15 & 0x3ffffff);
        uVar18 = uVar18 & 0x3ffffff;
        uVar4 = uVar18 + 5;
        uVar20 = (uVar4 >> 0x1a) + uVar21;
        uVar15 = (uVar20 >> 0x1a) + uVar17;
        uVar6 = (uVar15 >> 0x1a) + uVar19;
        uVar26 = uVar6 >> 0x1a;
        uVar28 = (int)(uVar26 + (uVar27 & 0x3ffffff) + -0x4000000) >> 0x1f;
        uVar9 = 0xffffffff - uVar28 & 0x3ffffff;
        uVar20 = uVar20 & uVar9 | uVar21 & uVar28;
        uVar17 = uVar15 & uVar9 | uVar17 & uVar28;
        uVar15 = uVar9 & uVar6 | uVar19 & uVar28;
        uVar6 = *(uint *)(local_68 + 0x14);
        uVar7 = (ulong)*(uint *)(local_68 + 0x10) +
                (ulong)(uVar20 << 0x1a | uVar4 & uVar9 | uVar18 & uVar28);
        uVar4 = *(uint *)(local_68 + 0x18);
        uVar9 = *(uint *)(local_68 + 0x1c);
        *local_60 = (uchar)uVar7;
        local_60[1] = (uchar)(uVar7 >> 8);
        local_60[2] = (uchar)(uVar7 >> 0x10);
        local_60[3] = (uchar)(uVar7 >> 0x18);
        uVar7 = (uVar7 >> 0x20) + (ulong)uVar6 + (ulong)(uVar17 << 0x14 | uVar20 >> 6);
        local_60[4] = (uchar)uVar7;
        local_60[5] = (uchar)(uVar7 >> 8);
        local_60[6] = (uchar)(uVar7 >> 0x10);
        local_60[7] = (uchar)(uVar7 >> 0x18);
        uVar7 = (uVar7 >> 0x20) + (ulong)uVar4 + (ulong)(uVar15 << 0xe | uVar17 >> 0xc);
        local_60[8] = (uchar)uVar7;
        local_60[9] = (uchar)(uVar7 >> 8);
        local_60[10] = (uchar)(uVar7 >> 0x10);
        local_60[0xb] = (uchar)(uVar7 >> 0x18);
        lVar8 = (uVar7 >> 0x20) +
                (ulong)uVar9 +
                (ulong)((0xffffffff - uVar28 & uVar26 + (uVar27 & 0x3ffffff) | uVar28 & uVar27) << 8
                       | uVar15 >> 0x12);
        local_60[0xc] = (uchar)lVar8;
        local_60[0xd] = (uchar)((ulong)lVar8 >> 8);
        local_60[0xe] = (uchar)((ulong)lVar8 >> 0x10);
        local_60[0xf] = (uchar)((ulong)lVar8 >> 0x18);
        return;
      }
      for (sVar5 = 0; inlen != sVar5; sVar5 = sVar5 + 1) {
        *(undefined1 *)((long)&local_88 + sVar5) = *(undefined1 *)((long)m + sVar5);
      }
      uVar3 = 1;
      do {
        *(undefined1 *)((long)&local_88 + inlen) = uVar3;
        inlen = inlen + 1;
        uVar3 = 0;
      } while (inlen != 0x10);
      uVar9 = (local_88 & 0x3ffffff) + uVar9;
      uVar15 = ((uint)(CONCAT44(local_84,local_88) >> 0x1a) & 0x3ffffff) + uVar15;
      uVar18 = ((uint)(CONCAT44(local_80,local_84) >> 0x14) & 0x3ffffff) + uVar18;
      uVar4 = ((uint)(CONCAT44(local_7c,local_80) >> 0xe) & 0x3ffffff) + uVar4;
      uVar27 = (local_7c >> 8) + uVar27;
      inlen = 0;
      local_70 = (ulong *)m;
    }
  } while( true );
}

Assistant:

void
poly1305_auth(unsigned char out[POLY1305_TAGLEN], const unsigned char *m,
              size_t inlen, const unsigned char key[POLY1305_KEYLEN]) {
    uint32_t t0;
    uint32_t t1;
    uint32_t t2;
    uint32_t t3;
    uint32_t h0;
    uint32_t h1;
    uint32_t h2;
    uint32_t h3;
    uint32_t h4;
    uint32_t r0;
    uint32_t r1;
    uint32_t r2;
    uint32_t r3;
    uint32_t r4;
    uint32_t s1;
    uint32_t s2;
    uint32_t s3;
    uint32_t s4;
    uint32_t b;
    uint32_t nb;
    size_t j;
    uint64_t t[5];
    uint64_t f0;
    uint64_t f1;
    uint64_t f2;
    uint64_t f3;
    uint32_t g0;
    uint32_t g1;
    uint32_t g2;
    uint32_t g3;
    uint32_t g4;
    uint64_t c;
    unsigned char mp[16];

    /* clamp key */
    t0 = U8TO32_LE(key + 0);
    t1 = U8TO32_LE(key + 4);
    t2 = U8TO32_LE(key + 8);
    t3 = U8TO32_LE(key + 12);

    /* precompute multipliers */
    r0 = t0 & 0x3ffffff; t0 >>= 26; t0 |= t1 << 6;
    r1 = t0 & 0x3ffff03; t1 >>= 20; t1 |= t2 << 12;
    r2 = t1 & 0x3ffc0ff; t2 >>= 14; t2 |= t3 << 18;
    r3 = t2 & 0x3f03fff; t3 >>= 8;
    r4 = t3 & 0x00fffff;

    s1 = r1 * 5;
    s2 = r2 * 5;
    s3 = r3 * 5;
    s4 = r4 * 5;

    /* init state */
    h0 = 0;
    h1 = 0;
    h2 = 0;
    h3 = 0;
    h4 = 0;

    /* full blocks */
    if(inlen < 16)
        goto poly1305_donna_atmost15bytes;

poly1305_donna_16bytes:
    m += 16;
    inlen -= 16;

    t0 = U8TO32_LE(m-16);
    t1 = U8TO32_LE(m-12);
    t2 = U8TO32_LE(m-8);
    t3 = U8TO32_LE(m-4);

    h0 += t0 & 0x3ffffff;
    h1 += ((uint32_t)((((uint64_t)t1 << 32) | t0) >> 26) & 0x3ffffff);
    h2 += ((uint32_t)((((uint64_t)t2 << 32) | t1) >> 20) & 0x3ffffff);
    h3 += ((uint32_t)((((uint64_t)t3 << 32) | t2) >> 14) & 0x3ffffff);
    h4 += (t3 >> 8) | (1 << 24);


poly1305_donna_mul:
    t[0] = mul32x32_64(h0, r0) + mul32x32_64(h1, s4) + mul32x32_64(h2, s3) +
        mul32x32_64(h3, s2) + mul32x32_64(h4, s1);
    t[1] = mul32x32_64(h0, r1) + mul32x32_64(h1, r0) + mul32x32_64(h2, s4) +
        mul32x32_64(h3, s3) + mul32x32_64(h4, s2);
    t[2] = mul32x32_64(h0, r2) + mul32x32_64(h1, r1) + mul32x32_64(h2, r0) +
        mul32x32_64(h3, s4) + mul32x32_64(h4, s3);
    t[3] = mul32x32_64(h0, r3) + mul32x32_64(h1, r2) + mul32x32_64(h2, r1) +
        mul32x32_64(h3, r0) + mul32x32_64(h4, s4);
    t[4] = mul32x32_64(h0, r4) + mul32x32_64(h1, r3) + mul32x32_64(h2, r2) +
        mul32x32_64(h3, r1) + mul32x32_64(h4, r0);

    h0 = (uint32_t)t[0] & 0x3ffffff;
    c = (t[0] >> 26);

    t[1] += c;
    h1 = (uint32_t)t[1] & 0x3ffffff;
    b = (uint32_t)(t[1] >> 26);

    t[2] += b;
    h2 = (uint32_t)t[2] & 0x3ffffff;
    b = (uint32_t)(t[2] >> 26);

    t[3] += b;
    h3 = (uint32_t)t[3] & 0x3ffffff;
    b = (uint32_t)(t[3] >> 26);

    t[4] += b;
    h4 = (uint32_t)t[4] & 0x3ffffff;
    b = (uint32_t)(t[4] >> 26);

    h0 += b * 5;

    if(inlen >= 16)
        goto poly1305_donna_16bytes;

    /* final bytes */
poly1305_donna_atmost15bytes:
    if(!inlen)
        goto poly1305_donna_finish;

    for(j = 0; j < inlen; j++) mp[j] = m[j];
    mp[j++] = 1;
    for(; j < 16; j++)
        mp[j] = 0;

    inlen = 0;

    t0 = U8TO32_LE(mp + 0);
    t1 = U8TO32_LE(mp + 4);
    t2 = U8TO32_LE(mp + 8);
    t3 = U8TO32_LE(mp + 12);

    h0 += t0 & 0x3ffffff;
    h1 += ((uint32_t)((((uint64_t)t1 << 32) | t0) >> 26) & 0x3ffffff);
    h2 += ((uint32_t)((((uint64_t)t2 << 32) | t1) >> 20) & 0x3ffffff);
    h3 += ((uint32_t)((((uint64_t)t3 << 32) | t2) >> 14) & 0x3ffffff);
    h4 += (t3 >> 8);

    goto poly1305_donna_mul;

poly1305_donna_finish:
    b = h0 >> 26; h0 = h0 & 0x3ffffff;
    h1 +=     b; b = h1 >> 26; h1 = h1 & 0x3ffffff;
    h2 +=     b; b = h2 >> 26; h2 = h2 & 0x3ffffff;
    h3 +=     b; b = h3 >> 26; h3 = h3 & 0x3ffffff;
    h4 +=     b; b = h4 >> 26; h4 = h4 & 0x3ffffff;
    h0 += b * 5; b = h0 >> 26; h0 = h0 & 0x3ffffff;
    h1 +=     b;

    g0 = h0 + 5; b = g0 >> 26; g0 &= 0x3ffffff;
    g1 = h1 + b; b = g1 >> 26; g1 &= 0x3ffffff;
    g2 = h2 + b; b = g2 >> 26; g2 &= 0x3ffffff;
    g3 = h3 + b; b = g3 >> 26; g3 &= 0x3ffffff;
    g4 = h4 + b - (1 << 26);

    b = (g4 >> 31) - 1;
    nb = ~b;
    h0 = (h0 & nb) | (g0 & b);
    h1 = (h1 & nb) | (g1 & b);
    h2 = (h2 & nb) | (g2 & b);
    h3 = (h3 & nb) | (g3 & b);
    h4 = (h4 & nb) | (g4 & b);

    f0 = ((h0      ) | (h1 << 26)) + (uint64_t)U8TO32_LE(&key[16]);
    f1 = ((h1 >>  6) | (h2 << 20)) + (uint64_t)U8TO32_LE(&key[20]);
    f2 = ((h2 >> 12) | (h3 << 14)) + (uint64_t)U8TO32_LE(&key[24]);
    f3 = ((h3 >> 18) | (h4 <<  8)) + (uint64_t)U8TO32_LE(&key[28]);

    U32TO8_LE(&out[ 0], f0); f1 += (f0 >> 32);
    U32TO8_LE(&out[ 4], f1); f2 += (f1 >> 32);
    U32TO8_LE(&out[ 8], f2); f3 += (f2 >> 32);
    U32TO8_LE(&out[12], f3);
}